

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_segwit_tests.cpp
# Opt level: O3

void __thiscall
script_segwit_tests::IsWitnessProgram_Invalid_Size::test_method(IsWitnessProgram_Invalid_Size *this)

{
  size_type new_capacity;
  uint uVar1;
  pointer pbVar2;
  value_type *__val;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b;
  const_string file;
  span<const_std::byte,_18446744073709551615UL> b_00;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  check_type cVar6;
  char *local_118;
  char *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  lazy_ostream local_c8;
  undefined1 *local_b8;
  char **local_b0;
  assertion_result local_a8;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  undefined1 local_58 [28];
  uint uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar2 = (pointer)operator_new(1);
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = pbVar2 + 1;
  *pbVar2 = 0;
  local_58._16_8_ = 0;
  stack0xffffffffffffffc0 = 0;
  local_58._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
  local_58._8_8_ = 0;
  local_c8._vptr_lazy_ostream =
       (_func_int **)((ulong)local_c8._vptr_lazy_ostream & 0xffffffffffffff00);
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = pbVar2;
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,(iterator)local_58,
             (uchar *)&local_c8);
  b._M_extent._M_extent_value = 1;
  b._M_ptr = pbVar2;
  CScript::operator<<((CScript *)local_58,b);
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_segwit_tests.cpp"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x7e;
  file.m_begin = (iterator)&local_80;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_90,msg);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)anon_unknown_20::IsNoWitnessProgram((CScript *)local_58);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8 = "IsNoWitnessProgram(nowit)";
  local_d0 = "";
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_segwit_tests.cpp"
  ;
  local_e0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  local_b0 = &local_d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_c8,1,0,WARN,_cVar6,(size_t)&local_e8,0x7e);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,0);
  new_capacity = uStack_3c - 0x1d;
  if (uStack_3c < 0x1d) {
    new_capacity = uStack_3c;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,new_capacity);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_70,0x29);
  ppVar3 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58._0_8_;
  uVar1 = uStack_3c - 0x1d;
  if (uStack_3c < 0x1d) {
    ppVar3 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58;
    uVar1 = uStack_3c;
  }
  local_c8._vptr_lazy_ostream =
       (_func_int **)((ulong)local_c8._vptr_lazy_ostream & 0xffffffffffffff00);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,
             (uchar *)((long)&ppVar3->_union + (long)(int)uVar1),(uchar *)&local_c8);
  b_00._M_extent._M_extent_value =
       (long)local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  b_00._M_ptr = local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  CScript::operator<<((CScript *)local_58,b_00);
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_segwit_tests.cpp"
  ;
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x83;
  file_00.m_begin = (iterator)&local_f8;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_108,
             msg_00);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)anon_unknown_20::IsNoWitnessProgram((CScript *)local_58);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8 = "IsNoWitnessProgram(nowit)";
  local_d0 = "";
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_segwit_tests.cpp"
  ;
  local_110 = "";
  local_b0 = &local_d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_c8,1,0,WARN,_cVar6,(size_t)&local_118,0x83);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  if (0x1c < uStack_3c) {
    free((void *)local_58._0_8_);
  }
  if (local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(IsWitnessProgram_Invalid_Size)
{
    std::vector<unsigned char> program(1);
    CScript nowit;
    nowit << OP_0 << program;
    BOOST_CHECK(IsNoWitnessProgram(nowit));

    nowit.clear();
    program.resize(41);
    nowit << OP_0 << program;
    BOOST_CHECK(IsNoWitnessProgram(nowit));
}